

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

out_of_range *
nlohmann::detail::out_of_range::create
          (out_of_range *__return_storage_ptr__,int id_,string *what_arg)

{
  string w;
  allocator local_79;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_78,"out_of_range",&local_79);
  exception::name(&local_58,&local_78,id_);
  std::operator+(&local_38,&local_58,what_arg);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  out_of_range(__return_storage_ptr__,id_,local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static out_of_range create(int id_, const std::string& what_arg)
    {
        std::string w = exception::name("out_of_range", id_) + what_arg;
        return out_of_range(id_, w.c_str());
    }